

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void inspect_serialized_object<char_const*>
               (char **serialized_bytes,bool *is_isotree_model,bool *is_compatible,
               bool *has_combined_objects,bool *has_IsoForest,bool *has_ExtIsoForest,
               bool *has_Imputer,bool *has_Indexer,bool *has_metadata,size_t *size_metadata,
               bool *has_same_int_size,bool *has_same_size_t_size,bool *has_same_endianness,
               bool *lacks_range_penalty,bool *lacks_scoring_metric)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  bool *pbVar4;
  bool lacks_indexer;
  PlatformSize saved_size_t;
  bool has_incomplete_watermark;
  bool has_same_double;
  size_t size_model [4];
  PlatformEndianness saved_endian;
  PlatformSize saved_int_t;
  
  pcVar2 = *serialized_bytes;
  *is_isotree_model = false;
  *is_compatible = false;
  *has_combined_objects = false;
  *has_IsoForest = false;
  *has_ExtIsoForest = false;
  *has_Imputer = false;
  *has_Indexer = false;
  *has_metadata = false;
  *size_metadata = 0;
  lacks_indexer = false;
  has_same_double = false;
  has_incomplete_watermark = false;
  check_setup_info<char_const*>
            (serialized_bytes,is_isotree_model,&has_incomplete_watermark,&has_same_double,
             has_same_int_size,has_same_size_t_size,has_same_endianness,&saved_int_t,&saved_size_t,
             &saved_endian,is_compatible,lacks_range_penalty,lacks_scoring_metric,&lacks_indexer);
  if (*is_isotree_model != true) {
    return;
  }
  if (*is_compatible != true) {
    return;
  }
  pcVar3 = *serialized_bytes;
  cVar1 = *pcVar3;
  *serialized_bytes = pcVar3 + 1;
  pbVar4 = has_IsoForest;
  switch(cVar1) {
  case '\x01':
    break;
  case '\x02':
    pbVar4 = has_ExtIsoForest;
    break;
  case '\x03':
    pbVar4 = has_Imputer;
    break;
  case '\x05':
    *has_Indexer = true;
  case '\x04':
    pbVar4 = has_combined_objects;
    break;
  default:
    goto switchD_0030d9e3_default;
  }
  *pbVar4 = true;
switchD_0030d9e3_default:
  if (*has_combined_objects != true) goto switchD_0030da41_caseD_3;
  size_model[2] = 0;
  size_model[3] = 0;
  size_model[0] = 0;
  size_model[1] = 0;
  cVar1 = pcVar3[1];
  *serialized_bytes = pcVar3 + 2;
  switch(cVar1) {
  case '\x01':
    *has_IsoForest = true;
    goto switchD_0030da41_caseD_3;
  case '\x02':
    *has_ExtIsoForest = true;
  default:
    goto switchD_0030da41_caseD_3;
  case '\x04':
    *has_IsoForest = true;
    has_Indexer = has_Imputer;
    break;
  case '\x05':
    *has_ExtIsoForest = true;
    has_Indexer = has_Imputer;
    break;
  case '\x06':
    *has_IsoForest = true;
    goto LAB_0030db0a;
  case '\a':
    *has_ExtIsoForest = true;
    goto LAB_0030db0a;
  case '\b':
    *has_IsoForest = true;
    goto LAB_0030da97;
  case '\t':
    *has_ExtIsoForest = true;
LAB_0030da97:
    *has_Imputer = true;
LAB_0030db0a:
    *has_metadata = true;
    read_bytes_size_t<char_const*>
              (size_model,4 - (ulong)lacks_indexer,serialized_bytes,saved_size_t,
               *has_same_endianness);
    size_model[3] = size_model[lacks_indexer ^ 3];
LAB_0030db49:
    *size_metadata = size_model[3];
    goto switchD_0030da41_caseD_3;
  case '\f':
    *has_IsoForest = true;
    break;
  case '\r':
    *has_IsoForest = true;
    goto LAB_0030db5b;
  case '\x0e':
    *has_ExtIsoForest = true;
    break;
  case '\x0f':
    *has_ExtIsoForest = true;
LAB_0030db5b:
    *has_Imputer = true;
    break;
  case '\x10':
    *has_IsoForest = true;
    goto LAB_0030dab9;
  case '\x11':
    *has_ExtIsoForest = true;
    goto LAB_0030dab9;
  case '\x12':
    *has_IsoForest = true;
    goto LAB_0030daaf;
  case '\x13':
    *has_ExtIsoForest = true;
LAB_0030daaf:
    *has_Imputer = true;
LAB_0030dab9:
    *has_Indexer = true;
    *has_metadata = true;
    read_bytes_size_t<char_const*>(size_model,4,serialized_bytes,saved_size_t,*has_same_endianness);
    goto LAB_0030db49;
  }
  *has_Indexer = true;
switchD_0030da41_caseD_3:
  *serialized_bytes = pcVar2;
  return;
}

Assistant:

void inspect_serialized_object
(
    itype &serialized_bytes,
    bool &is_isotree_model,
    bool &is_compatible,
    bool &has_combined_objects,
    bool &has_IsoForest,
    bool &has_ExtIsoForest,
    bool &has_Imputer,
    bool &has_Indexer,
    bool &has_metadata,
    size_t &size_metadata,
    bool &has_same_int_size,
    bool &has_same_size_t_size,
    bool &has_same_endianness,
    bool &lacks_range_penalty,
    bool &lacks_scoring_metric
)
{
    auto saved_position = set_return_position(serialized_bytes);

    is_isotree_model = false;
    is_compatible = false;
    has_combined_objects = false;
    has_IsoForest = false;
    has_ExtIsoForest = false;
    has_Imputer = false;
    has_Indexer = false;
    has_metadata = false;
    size_metadata = 0;

    bool lacks_indexer = false;

    bool has_same_double = false;
    bool has_incomplete_watermark = false;
    PlatformSize saved_int_t;
    PlatformSize saved_size_t;
    PlatformEndianness saved_endian;
    check_setup_info(
        serialized_bytes,
        is_isotree_model,
        has_incomplete_watermark,
        has_same_double,
        has_same_int_size,
        has_same_size_t_size,
        has_same_endianness,
        saved_int_t,
        saved_size_t,
        saved_endian,
        is_compatible,
        lacks_range_penalty,
        lacks_scoring_metric,
        lacks_indexer
    );

    if (!is_isotree_model || !is_compatible)
        return;

    uint8_t model_type;
    read_bytes<uint8_t>((void*)&model_type, (size_t)1, serialized_bytes);

    switch(model_type)
    {
        case IsoForestModel:
        {
            has_IsoForest = true;
            break;
        }

        case ExtIsoForestModel:
        {
            has_ExtIsoForest = true;
            break;
        }

        case ImputerModel:
        {
            has_Imputer = true;
            break;
        }

        case IndexerModel:
        {
            has_Indexer = true;
        }

        case AllObjectsCombined:
        {
            has_combined_objects = true;
            break;
        }

        default:
        {

        }
    }

    if (has_combined_objects)
    {
        size_t size_model[4] = {0};

        read_bytes<uint8_t>((void*)&model_type, (size_t)1, serialized_bytes);
        switch(model_type)
        {
            case HasSingleVarModelNext:
            {
                has_IsoForest = true;
                break;
            }
            case HasExtModelNext:
            {
                has_ExtIsoForest = true;
                break;
            }
            case HasSingleVarModelPlusImputerNext:
            {
                has_IsoForest = true;
                has_Imputer = true;
                break;
            }
            case HasSingleVarModelPlusIndexerNext:
            {
                has_IsoForest = true;
                has_Indexer = true;
                break;
            }
            case HasSingleVarModelPlusImputerPlusIndexerNext:
            {
                has_IsoForest = true;
                has_Imputer = true;
                has_Indexer = true;
                break;
            }
            case HasExtModelPlusImputerNext:
            {
                has_ExtIsoForest = true;
                has_Imputer = true;
                break;
            }
            case HasExtModelPlusIndexerNext:
            {
                has_ExtIsoForest = true;
                has_Indexer = true;
                break;
            }
            case HasExtModelPlusImputerPlusIndexerNext:
            {
                has_ExtIsoForest = true;
                has_Imputer = true;
                has_Indexer = true;
                break;
            }
            case HasSingleVarModelPlusMetadataNext:
            {
                has_IsoForest = true;
                has_metadata = true;
                read_bytes_size_t(size_model, (size_t)(3+!lacks_indexer), serialized_bytes, saved_size_t, has_same_endianness);
                size_metadata = size_model[2+!lacks_indexer];
                break;
            }
            case HasSingleVarModelPlusIndexerPlusMetadataNext:
            {
                has_IsoForest = true;
                has_Indexer = true;
                has_metadata = true;
                read_bytes_size_t(size_model, (size_t)4, serialized_bytes, saved_size_t, has_same_endianness);
                size_metadata = size_model[3];
                break;
            }
            case HasExtModelPlusMetadataNext:
            {
                has_ExtIsoForest = true;
                has_metadata = true;
                read_bytes_size_t(size_model, (size_t)(3+!lacks_indexer), serialized_bytes, saved_size_t, has_same_endianness);
                size_metadata = size_model[2+!lacks_indexer];
                break;
            }
            case HasExtModelPlusIndexerPlusMetadataNext:
            {
                has_ExtIsoForest = true;
                has_Indexer = true;
                has_metadata = true;
                read_bytes_size_t(size_model, (size_t)4, serialized_bytes, saved_size_t, has_same_endianness);
                size_metadata = size_model[3];
                break;
                break;
            }
            case HasSingleVarModelPlusImputerPlusMetadataNext:
            {
                has_IsoForest = true;
                has_Imputer = true;
                has_metadata = true;
                read_bytes_size_t(size_model, (size_t)(3+!lacks_indexer), serialized_bytes, saved_size_t, has_same_endianness);
                size_metadata = size_model[2+!lacks_indexer];
                break;
            }
            case HasSingleVarModelPlusImputerPlusIndexerPlusMetadataNext:
            {
                has_IsoForest = true;
                has_Imputer = true;
                has_Indexer = true;
                has_metadata = true;
                read_bytes_size_t(size_model, (size_t)4, serialized_bytes, saved_size_t, has_same_endianness);
                size_metadata = size_model[3];
                break;
            }
            case HasExtModelPlusImputerPlusMetadataNext:
            {
                has_ExtIsoForest = true;
                has_Imputer = true;
                has_metadata = true;
                read_bytes_size_t(size_model, (size_t)(3+!lacks_indexer), serialized_bytes, saved_size_t, has_same_endianness);
                size_metadata = size_model[2+!lacks_indexer];
                break;
            }
            case HasExtModelPlusImputerPlusIndexerPlusMetadataNext:
            {
                has_ExtIsoForest = true;
                has_Imputer = true;
                has_Indexer = true;
                has_metadata = true;
                read_bytes_size_t(size_model, (size_t)4, serialized_bytes, saved_size_t, has_same_endianness);
                size_metadata = size_model[3];
                break;
            }
            
            default:
            {

            }
        }
    }

    return_to_position(serialized_bytes, saved_position);
}